

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O2

void __thiscall
RandomTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
::populate(RandomTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
           *this)

{
  pointer pbVar1;
  __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  _Var2;
  uint uVar3;
  result_type rVar4;
  size_t length;
  size_t sVar5;
  uniform_int_distribution<unsigned_int> word_length_distribution;
  uniform_int_distribution<unsigned_int> word_count_distribution;
  mt19937 randgen;
  param_type local_13e8;
  param_type local_13e0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_13d8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::clear(&this->m_tokens);
  (this->m_str)._M_string_length = 0;
  *(this->m_str)._M_dataplus._M_p = L'\0';
  uVar3 = std::chrono::_V2::system_clock::now();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,(ulong)uVar3);
  local_13e0._M_a = 5;
  local_13e0._M_b = 0x40;
  local_13e8._M_a = 0;
  local_13e8._M_b = 0x10;
  sVar5 = this->m_fixed_word_count;
  if (sVar5 == 0) {
    rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_13e0,&local_13b8);
    sVar5 = (size_t)rVar4;
  }
  while ((ulong)((long)(this->m_tokens).
                       super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_tokens).
                       super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5) < sVar5) {
    length = this->m_fixed_word_length;
    if (length == 0) {
      rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)&local_13e8,&local_13b8);
      length = (size_t)rVar4;
    }
    make_word<char32_t,std::__cxx11::u32string>
              (&local_13d8,length,
               (this->m_delim)._M_dataplus._M_p[(this->m_delim)._M_string_length - 1]);
    std::vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>>::
    emplace_back<std::__cxx11::u32string>
              ((vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>> *)
               &this->m_tokens,&local_13d8);
    std::__cxx11::u32string::~u32string((u32string *)&local_13d8);
    pbVar1 = (this->m_tokens).
             super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var2._M_current = pbVar1[-1]._M_dataplus._M_p;
    std::__cxx11::u32string::
    insert<__gnu_cxx::__normal_iterator<char32_t*,std::__cxx11::u32string>,void>
              ((u32string *)&this->m_str,
               (const_iterator)((this->m_str)._M_dataplus._M_p + (this->m_str)._M_string_length),
               _Var2,(__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                      )(_Var2._M_current + pbVar1[-1]._M_string_length));
    if ((ulong)((long)(this->m_tokens).
                      super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_tokens).
                      super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < sVar5) {
      _Var2._M_current = (this->m_delim)._M_dataplus._M_p;
      std::__cxx11::u32string::
      insert<__gnu_cxx::__normal_iterator<char32_t*,std::__cxx11::u32string>,void>
                ((u32string *)&this->m_str,
                 (const_iterator)((this->m_str)._M_dataplus._M_p + (this->m_str)._M_string_length),
                 _Var2,(__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                        )(_Var2._M_current + (this->m_delim)._M_string_length));
    }
  }
  return;
}

Assistant:

void populate() {
		m_tokens.clear();
		m_str.clear();

		std::mt19937 randgen(static_cast<unsigned int>(std::chrono::system_clock::now().time_since_epoch().count()));
		std::uniform_int_distribution<uint32_t> word_count_distribution(5, 64);
		std::uniform_int_distribution<uint32_t> word_length_distribution(0, 16);

		auto word_count = m_fixed_word_count;
		if (word_count == 0) {
			word_count = word_count_distribution(randgen);
		}

		while (m_tokens.size() < word_count) {
			auto word_length = m_fixed_word_length;
			if (word_length == 0) {
				word_length = word_length_distribution(randgen);
			}
			m_tokens.push_back(make_word<T, StringT>(word_length, m_delim.back()));
			m_str.insert(m_str.end(), m_tokens.back().begin(), m_tokens.back().end());
			if (m_tokens.size() < word_count) {
				m_str.insert(m_str.end(), m_delim.begin(), m_delim.end());
			}
		}
	}